

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

void __thiscall Tokenizer::get_tokens(Tokenizer *this)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  _Base_ptr p_Var3;
  ifstream *piVar4;
  bool bVar5;
  long *plVar6;
  value_type *pvVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  char *pcVar10;
  char character;
  string meta_string;
  string token;
  char comment_data [256];
  byte local_1a1;
  string local_1a0;
  deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_180;
  value_type local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [264];
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->symbol_map)._M_t._M_impl.super__Rb_tree_header;
  local_180 = (deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->token_queue
  ;
  do {
    while( true ) {
      do {
        do {
          plVar6 = (long *)std::istream::get((char *)this->file_stream);
          if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
            std::ifstream::close();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,
                              CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                       local_1a0.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                       local_178.field_2._M_local_buf[0]) + 1);
            }
            return;
          }
        } while ((local_1a1 < 0xe) && ((0x2600U >> (local_1a1 & 0x1f) & 1) != 0));
        p_Var3 = (this->symbol_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[(char)*(size_t *)(p_Var3 + 1) < (char)local_1a1]) {
          if ((char)local_1a1 <= (char)*(size_t *)(p_Var3 + 1)) {
            p_Var8 = p_Var3;
          }
        }
        p_Var9 = p_Var1;
        if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
           (p_Var9 = (_Rb_tree_header *)p_Var8,
           (char)local_1a1 < (char)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var9 = p_Var1;
        }
      } while ((p_Var9 != p_Var1) &&
              (bVar5 = tokenize_symbol(this,local_1a1,&local_178,&local_1a0), bVar5));
      if (((char *)local_178._M_string_length == (char *)0x0) &&
         ((local_1a1 == 0x22 || ((char *)local_1a0._M_string_length != (char *)0x0)))) break;
      bVar2 = *local_178._M_dataplus._M_p;
      pvVar7 = &local_178;
      if ((bVar2 == 0x2f) && ((local_1a1 == 0x2f || (local_178._M_dataplus._M_p[1] == 0x2f)))) {
        piVar4 = this->file_stream;
        std::ios::widen((char)*(undefined8 *)(*(long *)piVar4 + -0x18) + (char)piVar4);
        std::istream::getline((char *)piVar4,(long)local_138,'\0');
        pcVar10 = (char *)local_178._M_string_length;
      }
      else {
        pcVar10 = (char *)local_178._M_string_length;
        if (local_178._M_string_length < (char *)0x2 || bVar2 != 0x2f) {
          if (local_1a1 == 0x2a && (bVar2 ^ 0x2f) == 0) goto LAB_001303af;
        }
        else if ((local_178._M_dataplus._M_p[1] == 0x2a) ||
                (local_1a1 == 0x2a && (bVar2 ^ 0x2f) == 0)) {
LAB_001303af:
          if ((local_1a1 != 0x2f) ||
             ((local_178._M_dataplus._M_p + -1)[local_178._M_string_length] != 0x2a))
          goto LAB_00130469;
          goto LAB_0013044d;
        }
        if (local_1a1 != 0x20) goto LAB_00130469;
        if ((char *)local_178._M_string_length != (char *)0x0) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_180,&local_178);
          pcVar10 = (char *)local_178._M_string_length;
        }
      }
LAB_0013044d:
      std::__cxx11::string::_M_replace((ulong)pvVar7,0,pcVar10,0x1332e5);
    }
    if (local_1a1 == 0x22 && (char *)local_1a0._M_string_length != (char *)0x0) {
      std::operator+(&local_158,"0",&local_1a0);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_180,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      pvVar7 = &local_1a0;
      pcVar10 = (char *)local_1a0._M_string_length;
      goto LAB_0013044d;
    }
    pvVar7 = &local_1a0;
    if (local_1a1 == 0x22) {
      std::istream::get((char *)this->file_stream);
      pvVar7 = &local_1a0;
    }
LAB_00130469:
    std::__cxx11::string::push_back((char)pvVar7);
  } while( true );
}

Assistant:

void Tokenizer::get_tokens() {
    std::string token;
    // holds strings within text
    std::string meta_string;
    char character;
    char comment_data[256];
    int space_ascii = 32;

    while (file_stream.get(character)) {
        if (character == '\n' || character == '\t' || character == '\r')
            continue;

       if (symbol_map.count(character) > 0) {
            if (tokenize_symbol(character, token, meta_string)) {
                continue;
            }
        }

        if (!is_string(character, meta_string, token)) {
            if (is_singleline_comment(character, token)) {
                file_stream.getline(comment_data, 256);
                token = "";
                continue;
            }
            else if (is_multiline_comment(character, token)) {
                if (!is_multiline_end(character, token)) {
                    token += character;
                    continue;
                }
                token = "";
            }

            else if (static_cast<int>(character) == space_ascii) {
                if (!token.empty()) {
                    token_queue.push(token);
                }
                token = "";
            }
            else {
                token += character;
            }
        }
        else if ((!meta_string.empty() && character == '"')) {
            token_queue.push("0"+meta_string);
            meta_string = "";
        }
        else {
            if (character == '"')
            {
                // dont store quotation marks in string but include the next character
                file_stream.get(character);
                meta_string += character;
            }
            else {
                meta_string += character;
            }
        }
    }
    file_stream.close();
}